

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Geometry *geometry,uint geomID,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  runtime_error *prVar4;
  undefined4 in_register_0000000c;
  size_t i;
  unsigned_long last;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *this_00;
  ulong uVar5;
  size_t *psVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  anon_class_1_0_00000001 local_29e1;
  size_t taskCount;
  undefined8 local_29d8;
  uint geomID_local;
  Geometry *geometry_local;
  unsigned_long *local_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  anon_class_24_3_3a534e91 *local_29a8;
  undefined8 uStack_29a0;
  mvector<PrimRef> *local_2990;
  mvector<PrimRef> *local_2988;
  long local_2980;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2978;
  undefined8 local_2968;
  undefined8 uStack_2960;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2958;
  undefined8 uStack_2950;
  undefined8 local_2948;
  undefined8 uStack_2940;
  undefined4 local_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  anon_class_24_3_3a534e91 local_2920;
  task_group_context context;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2888;
  size_t *local_2878;
  float fStack_2870;
  float fStack_286c;
  anon_class_24_3_3a534e91 *local_2868;
  undefined8 uStack_2860;
  undefined8 local_2858;
  undefined8 uStack_2850;
  size_t local_2848;
  size_t sStack_2840;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  local_2980 = CONCAT44(in_register_0000000c,geomID);
  geomID_local = (uint)geometry;
  geometry_local = (Geometry *)this;
  local_2988 = prims;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
  uVar1 = *(uint *)(this + 0x20);
  local_29d8 = 0;
  local_29c0 = (unsigned_long *)(ulong)uVar1;
  local_2888._0_8_ = &geometry_local;
  local_2888._8_8_ = numPrimRefs;
  local_2878 = (size_t *)&geomID_local;
  iVar3 = tbb::detail::d1::max_concurrency();
  uVar5 = (long)(ulong)uVar1 + 0x3ffU >> 10;
  if ((ulong)(long)iVar3 < uVar5) {
    uVar5 = (long)iVar3;
  }
  if (0x3f < uVar5) {
    uVar5 = 0x40;
  }
  local_2968 = &taskCount;
  local_2978._0_8_ = &local_29d8;
  uStack_2960 = &pstate;
  taskCount = uVar5;
  local_2978._8_8_ = &local_29c0;
  local_2958 = &local_2888;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2920.geometry = (Geometry **)&local_2978;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,uVar5,1,(anon_class_8_1_898bcfc2_conflict4 *)&local_2920,&context);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
  local_2990 = (mvector<PrimRef> *)numPrimRefs;
  if (cVar2 != '\0') {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"task cancelled");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_29a8 = (anon_class_24_3_3a534e91 *)0x7f8000007f800000;
  uStack_29a0 = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_29b8 = 0xff800000ff800000;
  uStack_29b0 = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  this_00 = pstate.sums;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  for (uVar5 = 0; uVar5 < taskCount; uVar5 = uVar5 + 1) {
    context.my_cpu_ctl_env =
         *(uint64_t *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0;
    context._8_8_ =
         *(undefined8 *)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                  field_0 + 8);
    context.field_6 =
         *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0;
    context.my_context_list =
         *(context_list **)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                  field_0 + 8);
    context.my_node.my_prev_node =
         *(intrusive_list_node **)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0;
    context.my_node.my_next_node =
         *(intrusive_list_node **)
          ((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.
                  field_0 + 8);
    context.my_exception._M_b._M_p =
         *(__base_type *)
          &this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0;
    context.my_itt_caller =
         *(void **)((long)&this_00[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                           upper.field_0 + 8);
    context.my_name = this_00[-0x40].begin;
    context.padding._0_8_ = this_00[-0x40].end;
    PrimInfoT<embree::BBox<embree::Vec3fa>_>::operator=(this_00,__return_storage_ptr__);
    createPrimRefArray_presplit<embree::QuadMesh,_embree::sse2::QuadSplitterFactory>::
    anon_class_1_0_00000001::operator()
              ((PrimInfo *)&local_2978.field_1,(anon_class_1_0_00000001 *)&local_2920,
               __return_storage_ptr__,(PrimInfo *)&context);
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_2978._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_2978._8_8_;
    *(size_t **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_2968;
    *(ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> **)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = uStack_2960;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_2958;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = uStack_2950;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_2948;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = uStack_2940;
    *(undefined4 *)&__return_storage_ptr__->begin = local_2938;
    *(undefined4 *)((long)&__return_storage_ptr__->begin + 4) = uStack_2934;
    *(undefined4 *)&__return_storage_ptr__->end = uStack_2930;
    *(undefined4 *)((long)&__return_storage_ptr__->end + 4) = uStack_292c;
    this_00 = this_00 + 1;
  }
  if (__return_storage_ptr__->end - __return_storage_ptr__->begin != local_2980) {
    (*(code *)((local_2988->alloc).device)->_vptr_MemoryMonitorInterface)(local_2988,0);
    uVar1 = geometry_local->numPrimitives;
    local_2920.geometry = &geometry_local;
    local_2920.prims = local_2990;
    local_2920.geomID = &geomID_local;
    local_29d8 = 0;
    local_29c0 = (unsigned_long *)(ulong)uVar1;
    iVar3 = tbb::detail::d1::max_concurrency();
    uVar5 = (long)(ulong)uVar1 + 0x3ffU >> 10;
    if ((ulong)(long)iVar3 < uVar5) {
      uVar5 = (long)iVar3;
    }
    last = 0x40;
    if (uVar5 < 0x40) {
      last = uVar5;
    }
    local_2978._0_8_ = &local_29d8;
    local_2978._8_8_ = &local_29c0;
    local_2968 = &taskCount;
    uStack_2960 = &pstate;
    taskCount = last;
    local_2958 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&local_2920;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_2888._0_8_ = &local_2978;
    tbb::detail::d1::
    parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
              (0,last,1,(anon_class_8_1_898bcfc2_conflict4 *)&local_2888.field_1,&context);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar2 != '\0') {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"task cancelled");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    local_2888._0_8_ = (undefined8 *)0x7f8000007f800000;
    local_2888._8_8_ = (unsigned_long **)0x7f8000007f800000;
    local_2878 = (size_t *)0xff800000ff800000;
    fStack_2870 = -INFINITY;
    fStack_286c = -INFINITY;
    local_2868 = (anon_class_24_3_3a534e91 *)0x7f8000007f800000;
    uStack_2860 = 0x7f8000007f800000;
    local_2858 = 0xff800000ff800000;
    uStack_2850 = 0xff800000ff800000;
    local_2848 = 0;
    sStack_2840 = 0;
    psVar6 = &pstate.sums[0].begin;
    fVar7 = -INFINITY;
    fVar8 = -INFINITY;
    uVar9 = INFINITY;
    uVar10 = INFINITY;
    uVar11 = INFINITY;
    uVar12 = INFINITY;
    for (uVar5 = 0; uVar5 < taskCount; uVar5 = uVar5 + 1) {
      context.my_cpu_ctl_env = psVar6[-0x288];
      context._8_8_ = psVar6[-0x287];
      context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(psVar6 + -0x286);
      context.my_context_list = (context_list *)psVar6[-0x285];
      context.my_node.my_prev_node = (intrusive_list_node *)psVar6[-0x284];
      context.my_node.my_next_node = (intrusive_list_node *)psVar6[-0x283];
      context.my_exception._M_b._M_p = (__base_type)psVar6[-0x282];
      context.my_itt_caller = (void *)psVar6[-0x281];
      context.my_name = psVar6[-0x280];
      context.padding._0_8_ = psVar6[-0x27f];
      (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar6 + -8))->
      super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.m128[0] = (float)uVar9
      ;
      *(undefined4 *)((long)psVar6 + -0x3c) = uVar10;
      *(undefined4 *)(psVar6 + -7) = uVar11;
      *(undefined4 *)((long)psVar6 + -0x34) = uVar12;
      (((Vec3fa *)(psVar6 + -6))->field_0).m128[0] = fVar7;
      *(float *)((long)psVar6 + -0x2c) = fVar8;
      *(float *)(psVar6 + -5) = fStack_2870;
      *(float *)((long)psVar6 + -0x24) = fStack_286c;
      *(anon_class_24_3_3a534e91 **)&(((BBox3fa *)(psVar6 + -4))->lower).field_0 = local_29a8;
      psVar6[-3] = uStack_29a0;
      *(undefined8 *)&((Vec3fa *)(psVar6 + -2))->field_0 = local_29b8;
      psVar6[-1] = uStack_29b0;
      *psVar6 = local_2848;
      psVar6[1] = sStack_2840;
      createPrimRefArray_presplit<embree::QuadMesh,_embree::sse2::QuadSplitterFactory>::
      anon_class_1_0_00000001::operator()
                ((PrimInfo *)&local_2978.field_1,&local_29e1,(PrimInfo *)&local_2888.field_1,
                 (PrimInfo *)&context);
      fStack_2870 = (float)uStack_2960;
      fStack_286c = uStack_2960._4_4_;
      local_29a8 = (anon_class_24_3_3a534e91 *)local_2958;
      uStack_29a0 = uStack_2950;
      local_29b8 = local_2948;
      uStack_29b0 = uStack_2940;
      local_2888._0_8_ = local_2978._0_8_;
      local_2888._8_8_ = local_2978._8_8_;
      local_2878 = local_2968;
      local_2848 = CONCAT44(uStack_2934,local_2938);
      sStack_2840 = CONCAT44(uStack_292c,uStack_2930);
      psVar6 = psVar6 + 10;
      fVar7 = (float)local_2968;
      fVar8 = local_2968._4_4_;
      uVar9 = local_2978.m128[0];
      uVar10 = local_2978.m128[1];
      uVar11 = local_2978.m128[2];
      uVar12 = local_2978.m128[3];
      local_2868 = local_29a8;
      uStack_2860 = uStack_29a0;
      local_2858 = local_29b8;
      uStack_2850 = uStack_29b0;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[0] = (float)uVar9;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[1] = (float)uVar10;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[2] = (float)uVar11;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
    .m128[3] = (float)uVar12;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[0] = fVar7;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[1] = fVar8;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[2] = fStack_2870;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
    .m128[3] = fStack_286c;
    *(anon_class_24_3_3a534e91 **)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_29a8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = uStack_29a0;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_29b8;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = uStack_29b0;
    __return_storage_ptr__->begin = local_2848;
    __return_storage_ptr__->end = sStack_2840;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Geometry* geometry, unsigned int geomID, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelPrefixSumState<PrimInfo> pstate;
      
      /* first try */
      progressMonitor(0);
      PrimInfo pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	  return geometry->createPrimRefArray(prims,r,r.begin(),geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_prefix_sum( pstate, size_t(0), geometry->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
	      return geometry->createPrimRefArray(prims,r,base.size(),geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}
      return pinfo;	
    }